

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

void __thiscall
BanMan::BanMan(BanMan *this,path *ban_file,CClientUIInterface *client_interface,
              int64_t default_ban_time)

{
  long lVar1;
  undefined8 in_RCX;
  double in_RDX;
  undefined8 in_RSI;
  CRollingBloomFilter *in_RDI;
  long in_FS_OFFSET;
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  *in_stack_ffffffffffffff58;
  int *ban_list_path;
  CBanDB *this_00;
  uint nElements;
  CRollingBloomFilter *this_01;
  BanMan *in_stack_ffffffffffffffd8;
  
  nElements = (uint)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff58);
  std::
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::map(in_stack_ffffffffffffff58);
  *(undefined1 *)&in_RDI[1].nTweak = 0;
  *(double *)(in_RDI + 2) = in_RDX;
  ban_list_path = &in_RDI[2].nGeneration;
  this_00 = (CBanDB *)&stack0xffffffffffffffd0;
  fs::path::path((path *)in_stack_ffffffffffffff58,(path *)0xf12dbe);
  CBanDB::CBanDB(this_00,(path *)ban_list_path);
  fs::path::~path((path *)in_stack_ffffffffffffff58);
  in_RDI[3].nTweak = (int)in_RCX;
  in_RDI[3].nHashFuncs = (int)((ulong)in_RCX >> 0x20);
  CRollingBloomFilter::CRollingBloomFilter(this_01,nElements,in_RDX);
  LoadBanlist(in_stack_ffffffffffffffd8);
  DumpBanlist(in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BanMan::BanMan(fs::path ban_file, CClientUIInterface* client_interface, int64_t default_ban_time)
    : m_client_interface(client_interface), m_ban_db(std::move(ban_file)), m_default_ban_time(default_ban_time)
{
    LoadBanlist();
    DumpBanlist();
}